

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O3

Token __thiscall Lexer::tokenType(Lexer *this)

{
  _Map_pointer ppTVar1;
  _Map_pointer ppTVar2;
  bool bVar3;
  _Elt_pointer pTVar4;
  bool local_a;
  bool local_9;
  
  pTVar4 = (this->m_tokenPosition)._M_cur;
  ppTVar1 = (this->m_tokenPosition)._M_node;
  ppTVar2 = (this->m_tokens)._deque.
            super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  bVar3 = ppTVar1 < ppTVar2;
  if (ppTVar1 == ppTVar2) {
    bVar3 = pTVar4 < (this->m_tokens)._deque.
                     super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
  }
  if (bVar3) {
    ppTVar2 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    bVar3 = ppTVar2 <= ppTVar1;
    if (ppTVar1 == ppTVar2) {
      bVar3 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur <= pTVar4;
    }
    if (bVar3) goto LAB_0011a2ad;
  }
  local_9 = false;
  local_a = true;
  error<bool,bool>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/lexer.h:86: hasValidToken() (%1) does not equal true (%2)"
                   ,&local_9,&local_a);
  pTVar4 = (this->m_tokenPosition)._M_cur;
LAB_0011a2ad:
  return pTVar4->type;
}

Assistant:

inline Token tokenType() const
	{
		return token()->type;
	}